

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Preprocessor::handleBeginKeywordsDirective(Preprocessor *this,Token directive)

{
  Trivia TVar1;
  bool bVar2;
  BeginKeywordsDirectiveSyntax *syntax;
  Preprocessor *in_RDI;
  Token TVar3;
  string_view sVar4;
  SourceRange SVar5;
  Preprocessor *unaff_retaddr;
  BeginKeywordsDirectiveSyntax *result;
  optional<slang::parsing::KeywordVersion> versionOpt;
  Token versionToken;
  SourceLocation in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  DiagCode in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  BumpAllocator *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb6;
  char *pcVar6;
  undefined1 local_10 [14];
  TokenKind in_stack_fffffffffffffffe;
  
  TVar3.info._0_4_ = in_stack_ffffffffffffff90;
  TVar3._0_8_ = in_stack_ffffffffffffff88;
  TVar3.info._4_4_ = in_stack_ffffffffffffff94;
  checkOutsideDesignElement((Preprocessor *)in_stack_ffffffffffffff80,TVar3);
  TVar3 = expect(unaff_retaddr,in_stack_fffffffffffffffe);
  pcVar6 = TVar3._0_8_;
  bVar2 = Token::isMissing((Token *)&stack0xffffffffffffffb8);
  if (!bVar2) {
    sVar4 = Token::valueText((Token *)in_stack_ffffffffffffff80);
    in_stack_ffffffffffffffa0 = (BumpAllocator *)sVar4._M_len;
    sVar4._M_len._6_2_ = in_stack_ffffffffffffffb6;
    sVar4._M_len._0_6_ = in_stack_ffffffffffffffb0;
    sVar4._M_str = pcVar6;
    LexerFacts::getKeywordVersion(sVar4);
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<slang::parsing::KeywordVersion> *)0x36b476);
    if (bVar2) {
      std::optional<slang::parsing::KeywordVersion>::operator*
                ((optional<slang::parsing::KeywordVersion> *)0x36b4cc);
      std::vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>::
      push_back((vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
                 *)in_stack_ffffffffffffff80,(value_type *)in_RDI);
    }
    else {
      in_stack_ffffffffffffff9c = 0x1b0004;
      SVar5 = Token::range((Token *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_stack_ffffffffffffff90 = SVar5.endLoc._0_4_;
      in_stack_ffffffffffffff94 = SVar5.endLoc._4_4_;
      SVar5.endLoc = SVar5.startLoc;
      SVar5.startLoc = in_stack_ffffffffffffff80;
      addDiag(in_RDI,in_stack_ffffffffffffff94,SVar5);
    }
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::BeginKeywordsDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (in_stack_ffffffffffffffa0,
                      (Token *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (Token *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  Trivia::Trivia((Trivia *)local_10,Directive,(SyntaxNode *)syntax);
  TVar1._14_2_ = in_stack_fffffffffffffffe;
  TVar1.field_0 = (anon_union_12_4_39e54f29_for_Trivia_0)local_10._0_12_;
  TVar1.hasFullLocation = (bool)local_10[0xc];
  TVar1.kind = local_10[0xd];
  return TVar1;
}

Assistant:

Trivia Preprocessor::handleBeginKeywordsDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token versionToken = expect(TokenKind::StringLiteral);
    if (!versionToken.isMissing()) {
        auto versionOpt = LF::getKeywordVersion(versionToken.valueText());
        if (!versionOpt)
            addDiag(diag::UnrecognizedKeywordVersion, versionToken.range());
        else
            keywordVersionStack.push_back(*versionOpt);
    }

    auto result = alloc.emplace<BeginKeywordsDirectiveSyntax>(directive, versionToken);
    return Trivia(TriviaKind::Directive, result);
}